

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

PipelineWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateComputePipeline
          (PipelineWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkComputePipelineCreateInfo *PipelineCI,VkPipelineCache cache,char *DebugName)

{
  Char *Message;
  undefined1 local_88 [32];
  VkPipeline pVStack_68;
  VkResult err;
  VkPipeline vkPipeline;
  undefined1 local_50 [8];
  string msg;
  char *DebugName_local;
  VkPipelineCache cache_local;
  VkComputePipelineCreateInfo *PipelineCI_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (PipelineCI->sType != VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[67]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"PipelineCI.sType == VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO",
               (char (*) [67])cache);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CreateComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x10d);
    std::__cxx11::string::~string((string *)local_50);
  }
  if (msg.field_2._8_8_ == 0) {
    msg.field_2._8_8_ = (long)" \t" + 2;
  }
  pVStack_68 = (VkPipeline)0x0;
  local_88._28_4_ =
       (*vkCreateComputePipelines)
                 (this->m_VkDevice,cache,1,PipelineCI,this->m_VkAllocator,&stack0xffffffffffffff98);
  if (local_88._28_4_ != VK_SUCCESS) {
    local_88[0x1b] = 0x27;
    local_88._16_8_ = VkResultToString(local_88._28_4_);
    Diligent::LogError<true,char[36],char_const*,char,char[17],char_const*>
              (false,"CreateComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x115,(char (*) [36])"Failed to create compute pipeline \'",
               (char **)((long)&msg.field_2 + 8),local_88 + 0x1b,(char (*) [17])"\nVK Error Code: ",
               (char **)(local_88 + 0x10));
  }
  if (*(char *)msg.field_2._8_8_ != '\0') {
    SetPipelineName(this->m_VkDevice,pVStack_68,(char *)msg.field_2._8_8_);
  }
  GetSharedPtr((VulkanLogicalDevice *)local_88);
  VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::VulkanObjectWrapper
            (__return_storage_ptr__,
             (shared_ptr<const_VulkanUtilities::VulkanLogicalDevice> *)local_88,
             &stack0xffffffffffffff98);
  std::shared_ptr<const_VulkanUtilities::VulkanLogicalDevice>::~shared_ptr
            ((shared_ptr<const_VulkanUtilities::VulkanLogicalDevice> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

PipelineWrapper VulkanLogicalDevice::CreateComputePipeline(const VkComputePipelineCreateInfo& PipelineCI,
                                                           VkPipelineCache                    cache,
                                                           const char*                        DebugName) const
{
    VERIFY_EXPR(PipelineCI.sType == VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO);

    if (DebugName == nullptr)
        DebugName = "";

    VkPipeline vkPipeline = VK_NULL_HANDLE;

    VkResult err = vkCreateComputePipelines(m_VkDevice, cache, 1, &PipelineCI, m_VkAllocator, &vkPipeline);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create compute pipeline '", DebugName, '\'');

    if (*DebugName != 0)
        SetPipelineName(m_VkDevice, vkPipeline, DebugName);

    return PipelineWrapper{GetSharedPtr(), std::move(vkPipeline)};
}